

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlmalloc.c
# Opt level: O0

msegmentptr segment_holding(mstate m,char *addr)

{
  msegmentptr local_28;
  msegmentptr sp;
  char *addr_local;
  mstate m_local;
  
  local_28 = &m->seg;
  while ((addr < local_28->base || (local_28->base + local_28->size <= addr))) {
    local_28 = local_28->next;
    if (local_28 == (malloc_segment *)0x0) {
      return (msegmentptr)0x0;
    }
  }
  return local_28;
}

Assistant:

static msegmentptr segment_holding(mstate m, char* addr) {
  msegmentptr sp = &m->seg;
  for (;;) {
    if (addr >= sp->base && addr < sp->base + sp->size)
      return sp;
    if ((sp = sp->next) == 0)
      return 0;
  }
}